

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TriangularMatrixMatrix.h
# Opt level: O0

void Eigen::internal::
     triangular_product_impl<1,true,Eigen::Transpose<Eigen::Matrix<float,-1,-1,1,-1,-1>const>const,false,Eigen::Matrix<float,-1,-1,0,-1,-1>,false>
     ::run<Eigen::Matrix<float,_1,_1,0,_1,_1>>
               (Matrix<float,__1,__1,_0,__1,__1> *dst,
               Transpose<const_Eigen::Matrix<float,__1,__1,_1,__1,__1>_> *a_lhs,
               Matrix<float,__1,__1,_0,__1,__1> *a_rhs,Scalar *alpha)

{
  long _depth;
  Index _cols;
  Index _rows;
  long *plVar1;
  Scalar *_lhs;
  Index lhsStride;
  Scalar *_rhs;
  Index rhsStride;
  Scalar *_res;
  Index resIncr;
  Index resStride;
  undefined1 local_c0 [8];
  BlockingType blocking;
  Index local_80;
  long local_78;
  Index stripedDepth;
  Index stripedCols;
  Index stripedRows;
  Scalar local_58;
  Scalar actualAlpha;
  RhsScalar rhs_alpha;
  LhsScalar lhs_alpha;
  type rhs;
  type lhs;
  Scalar *alpha_local;
  Matrix<float,__1,__1,_0,__1,__1> *a_rhs_local;
  Transpose<const_Eigen::Matrix<float,__1,__1,_1,__1,__1>_> *a_lhs_local;
  Matrix<float,__1,__1,_0,__1,__1> *dst_local;
  
  lhs.m_matrix = (non_const_type)alpha;
  rhs = (type)blas_traits<Eigen::Transpose<const_Eigen::Matrix<float,_-1,_-1,_1,_-1,_-1>_>_>::
              extract(a_lhs);
  _rhs_alpha = &blas_traits<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::extract(a_rhs)->
                super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>;
  actualAlpha = blas_traits<Eigen::Transpose<const_Eigen::Matrix<float,_-1,_-1,_1,_-1,_-1>_>_>::
                extractScalarFactor(a_lhs);
  local_58 = blas_traits<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::extractScalarFactor(a_rhs);
  stripedRows._4_4_ =
       *(float *)&((lhs.m_matrix)->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_1,__1,__1>_>).
                  m_storage.m_data * actualAlpha * local_58;
  stripedCols = Transpose<const_Eigen::Matrix<float,_-1,_-1,_1,_-1,_-1>_>::rows
                          ((Transpose<const_Eigen::Matrix<float,__1,__1,_1,__1,__1>_> *)&rhs);
  stripedDepth = PlainObjectBase<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::cols(_rhs_alpha);
  local_80 = Transpose<const_Eigen::Matrix<float,_-1,_-1,_1,_-1,_-1>_>::cols
                       ((Transpose<const_Eigen::Matrix<float,__1,__1,_1,__1,__1>_> *)&rhs);
  blocking.m_sizeB =
       Transpose<const_Eigen::Matrix<float,_-1,_-1,_1,_-1,_-1>_>::rows
                 ((Transpose<const_Eigen::Matrix<float,__1,__1,_1,__1,__1>_> *)&rhs);
  plVar1 = std::min<long>(&local_80,&blocking.m_sizeB);
  local_78 = *plVar1;
  gemm_blocking_space<0,_float,_float,_-1,_-1,_-1,_4,_false>::gemm_blocking_space
            ((gemm_blocking_space<0,_float,_float,__1,__1,__1,_4,_false> *)local_c0,stripedCols,
             stripedDepth,local_78,1,false);
  _rows = stripedCols;
  _cols = stripedDepth;
  _depth = local_78;
  _lhs = TransposeImpl<const_Eigen::Matrix<float,_-1,_-1,_1,_-1,_-1>,_Eigen::Dense>::coeffRef
                   ((TransposeImpl<const_Eigen::Matrix<float,__1,__1,_1,__1,__1>,_Eigen::Dense> *)
                    &rhs,0,0);
  lhsStride = TransposeImpl<const_Eigen::Matrix<float,_-1,_-1,_1,_-1,_-1>,_Eigen::Dense>::
              outerStride((TransposeImpl<const_Eigen::Matrix<float,__1,__1,_1,__1,__1>,_Eigen::Dense>
                           *)&rhs);
  _rhs = PlainObjectBase<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::coeffRef(_rhs_alpha,0,0);
  rhsStride = Matrix<float,_-1,_-1,_0,_-1,_-1>::outerStride
                        ((Matrix<float,__1,__1,_0,__1,__1> *)_rhs_alpha);
  _res = PlainObjectBase<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::coeffRef
                   (&dst->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,0,0);
  resIncr = Matrix<float,_-1,_-1,_0,_-1,_-1>::innerStride(dst);
  resStride = Matrix<float,_-1,_-1,_0,_-1,_-1>::outerStride(dst);
  product_triangular_matrix_matrix<float,_long,_1,_true,_0,_false,_0,_false,_0,_1,_0>::run
            (_rows,_cols,_depth,_lhs,lhsStride,_rhs,rhsStride,_res,resIncr,resStride,
             (float *)((long)&stripedRows + 4),(level3_blocking<float,_float> *)local_c0);
  gemm_blocking_space<0,_float,_float,_-1,_-1,_-1,_4,_false>::~gemm_blocking_space
            ((gemm_blocking_space<0,_float,_float,__1,__1,__1,_4,_false> *)local_c0);
  return;
}

Assistant:

static void run(Dest& dst, const Lhs &a_lhs, const Rhs &a_rhs, const typename Dest::Scalar& alpha)
  {
    typedef typename Lhs::Scalar  LhsScalar;
    typedef typename Rhs::Scalar  RhsScalar;
    typedef typename Dest::Scalar Scalar;
    
    typedef internal::blas_traits<Lhs> LhsBlasTraits;
    typedef typename LhsBlasTraits::DirectLinearAccessType ActualLhsType;
    typedef typename internal::remove_all<ActualLhsType>::type ActualLhsTypeCleaned;
    typedef internal::blas_traits<Rhs> RhsBlasTraits;
    typedef typename RhsBlasTraits::DirectLinearAccessType ActualRhsType;
    typedef typename internal::remove_all<ActualRhsType>::type ActualRhsTypeCleaned;
    
    typename internal::add_const_on_value_type<ActualLhsType>::type lhs = LhsBlasTraits::extract(a_lhs);
    typename internal::add_const_on_value_type<ActualRhsType>::type rhs = RhsBlasTraits::extract(a_rhs);

    LhsScalar lhs_alpha = LhsBlasTraits::extractScalarFactor(a_lhs);
    RhsScalar rhs_alpha = RhsBlasTraits::extractScalarFactor(a_rhs);
    Scalar actualAlpha = alpha * lhs_alpha * rhs_alpha;

    typedef internal::gemm_blocking_space<(Dest::Flags&RowMajorBit) ? RowMajor : ColMajor,Scalar,Scalar,
              Lhs::MaxRowsAtCompileTime, Rhs::MaxColsAtCompileTime, Lhs::MaxColsAtCompileTime,4> BlockingType;

    enum { IsLower = (Mode&Lower) == Lower };
    Index stripedRows  = ((!LhsIsTriangular) || (IsLower))  ? lhs.rows() : (std::min)(lhs.rows(),lhs.cols());
    Index stripedCols  = ((LhsIsTriangular)  || (!IsLower)) ? rhs.cols() : (std::min)(rhs.cols(),rhs.rows());
    Index stripedDepth = LhsIsTriangular ? ((!IsLower) ? lhs.cols() : (std::min)(lhs.cols(),lhs.rows()))
                                         : ((IsLower)  ? rhs.rows() : (std::min)(rhs.rows(),rhs.cols()));

    BlockingType blocking(stripedRows, stripedCols, stripedDepth, 1, false);

    internal::product_triangular_matrix_matrix<Scalar, Index,
      Mode, LhsIsTriangular,
      (internal::traits<ActualLhsTypeCleaned>::Flags&RowMajorBit) ? RowMajor : ColMajor, LhsBlasTraits::NeedToConjugate,
      (internal::traits<ActualRhsTypeCleaned>::Flags&RowMajorBit) ? RowMajor : ColMajor, RhsBlasTraits::NeedToConjugate,
      (internal::traits<Dest          >::Flags&RowMajorBit) ? RowMajor : ColMajor, Dest::InnerStrideAtCompileTime>
      ::run(
        stripedRows, stripedCols, stripedDepth,   // sizes
        &lhs.coeffRef(0,0), lhs.outerStride(),    // lhs info
        &rhs.coeffRef(0,0), rhs.outerStride(),    // rhs info
        &dst.coeffRef(0,0), dst.innerStride(), dst.outerStride(),    // result info
        actualAlpha, blocking
      );

    // Apply correction if the diagonal is unit and a scalar factor was nested:
    if ((Mode&UnitDiag)==UnitDiag)
    {
      if (LhsIsTriangular && lhs_alpha!=LhsScalar(1))
      {
        Index diagSize = (std::min)(lhs.rows(),lhs.cols());
        dst.topRows(diagSize) -= ((lhs_alpha-LhsScalar(1))*a_rhs).topRows(diagSize);
      }
      else if ((!LhsIsTriangular) && rhs_alpha!=RhsScalar(1))
      {
        Index diagSize = (std::min)(rhs.rows(),rhs.cols());
        dst.leftCols(diagSize) -= (rhs_alpha-RhsScalar(1))*a_lhs.leftCols(diagSize);
      }
    }
  }